

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall wabt::WastLexer::GetToken(Token *__return_storage_ptr__,WastLexer *this)

{
  bool bVar1;
  int iVar2;
  Location local_100;
  string_view local_e0;
  string_view local_d0;
  string_view local_c0;
  string_view local_b0;
  Location local_a0;
  string_view local_80;
  Token local_70;
  string_view local_30;
  string_view local_20;
  WastLexer *local_10;
  WastLexer *this_local;
  
  local_10 = this;
  do {
    this->token_start_ = this->cursor_;
    iVar2 = PeekChar(this);
    switch(iVar2) {
    default:
      iVar2 = PeekChar(this);
      bVar1 = IsKeyword(iVar2);
      if (bVar1) {
        GetKeywordToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      iVar2 = PeekChar(this);
      bVar1 = IsIdChar(iVar2);
      if (bVar1) {
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
      ReadChar(this);
      GetLocation(&local_100,this);
      Error(this,0x29941a);
      break;
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      ReadWhitespace(this);
      break;
    case 0x22:
      GetStringToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x24:
      GetIdToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x28:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_20,"(;");
      bVar1 = MatchString(this,local_20);
      if (!bVar1) {
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"(@");
        bVar1 = MatchString(this,local_30);
        if (!bVar1) {
          ReadChar(this);
          BareToken(__return_storage_ptr__,this,Lpar);
          return __return_storage_ptr__;
        }
        GetIdToken(&local_70,this);
        TextToken(__return_storage_ptr__,this,LparAnn,2);
        return __return_storage_ptr__;
      }
      bVar1 = ReadBlockComment(this);
      if (!bVar1) {
        BareToken(__return_storage_ptr__,this,Eof);
        return __return_storage_ptr__;
      }
      break;
    case 0x29:
      ReadChar(this);
      BareToken(__return_storage_ptr__,this,Rpar);
      return __return_storage_ptr__;
    case 0x2b:
    case 0x2d:
      ReadChar(this);
      iVar2 = PeekChar(this);
      switch(iVar2) {
      case 0x30:
        goto switchD_0017604b_caseD_30;
      case 0x31:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
        GetNumberToken(__return_storage_ptr__,this,Int);
        return __return_storage_ptr__;
      default:
        GetReservedToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case 0x69:
        GetInfToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      case 0x6e:
        GetNanToken(__return_storage_ptr__,this);
        return __return_storage_ptr__;
      }
    case 0x30:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"0x");
      bVar1 = MatchString(this,local_c0);
      if (!bVar1) {
        GetNumberToken(__return_storage_ptr__,this,Last_Literal);
        return __return_storage_ptr__;
      }
      GetHexNumberToken(__return_storage_ptr__,this,Last_Literal);
      return __return_storage_ptr__;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      GetNumberToken(__return_storage_ptr__,this,Last_Literal);
      return __return_storage_ptr__;
    case 0x3b:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_80,";;");
      bVar1 = MatchString(this,local_80);
      if (bVar1) {
        bVar1 = ReadLineComment(this);
        if (!bVar1) {
          BareToken(__return_storage_ptr__,this,Eof);
          return __return_storage_ptr__;
        }
      }
      else {
        ReadChar(this);
        GetLocation(&local_a0,this);
        Error(this,0x29941a);
      }
      break;
    case 0x61:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"align=");
      GetNameEqNumToken(__return_storage_ptr__,this,local_d0,AlignEqNat);
      return __return_storage_ptr__;
    case 0x69:
      GetInfToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x6e:
      GetNanToken(__return_storage_ptr__,this);
      return __return_storage_ptr__;
    case 0x6f:
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"offset=");
      GetNameEqNumToken(__return_storage_ptr__,this,local_e0,OffsetEqNat);
      return __return_storage_ptr__;
    case -1:
      BareToken(__return_storage_ptr__,this,Eof);
      return __return_storage_ptr__;
    }
  } while( true );
switchD_0017604b_caseD_30:
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,"0x");
  bVar1 = MatchString(this,local_b0);
  if (!bVar1) {
    GetNumberToken(__return_storage_ptr__,this,Int);
    return __return_storage_ptr__;
  }
  GetHexNumberToken(__return_storage_ptr__,this,Int);
  return __return_storage_ptr__;
}

Assistant:

Token WastLexer::GetToken() {
  while (true) {
    token_start_ = cursor_;
    switch (PeekChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '(':
        if (MatchString("(;")) {
          if (ReadBlockComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else if (MatchString("(@")) {
          GetIdToken();
          // offset=2 to skip the "(@" prefix
          return TextToken(TokenType::LparAnn, 2);
        } else {
          ReadChar();
          return BareToken(TokenType::Lpar);
        }
        break;

      case ')':
        ReadChar();
        return BareToken(TokenType::Rpar);

      case ';':
        if (MatchString(";;")) {
          if (ReadLineComment()) {
            continue;
          }
          return BareToken(TokenType::Eof);
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
        break;

      case ' ':
      case '\t':
      case '\r':
      case '\n':
        ReadWhitespace();
        continue;

      case '"':
        return GetStringToken();

      case '+':
      case '-':
        ReadChar();
        switch (PeekChar()) {
          case 'i':
            return GetInfToken();

          case 'n':
            return GetNanToken();

          case '0':
            return MatchString("0x") ? GetHexNumberToken(TokenType::Int)
                                     : GetNumberToken(TokenType::Int);
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
            return GetNumberToken(TokenType::Int);

          default:
            return GetReservedToken();
        }
        break;

      case '0':
        return MatchString("0x") ? GetHexNumberToken(TokenType::Nat)
                                 : GetNumberToken(TokenType::Nat);

      case '1':
      case '2':
      case '3':
      case '4':
      case '5':
      case '6':
      case '7':
      case '8':
      case '9':
        return GetNumberToken(TokenType::Nat);

      case '$':
        return GetIdToken();

      case 'a':
        return GetNameEqNumToken("align=", TokenType::AlignEqNat);

      case 'i':
        return GetInfToken();

      case 'n':
        return GetNanToken();

      case 'o':
        return GetNameEqNumToken("offset=", TokenType::OffsetEqNat);

      default:
        if (IsKeyword(PeekChar())) {
          return GetKeywordToken();
        } else if (IsIdChar(PeekChar())) {
          return GetReservedToken();
        } else {
          ReadChar();
          ERROR("unexpected char");
          continue;
        }
    }
  }
}